

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O3

int cuddSymmCheck(DdManager *table,int x,int y)

{
  DdHalfWord DVar1;
  DdSubtable *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  DdNode *pDVar11;
  long lVar12;
  DdNode *pDVar13;
  DdHalfWord DVar14;
  DdNode *pDVar15;
  DdManager *pDVar16;
  DdNode *pDVar17;
  DdNode *pDVar18;
  DdNode *pDVar19;
  
  pDVar2 = table->subtables;
  uVar8 = 0;
  if (pDVar2[x].keys != 1) {
    DVar1 = table->invperm[y];
    if ((pDVar2[y].keys != 1) || (table->vars[(int)DVar1]->ref != 1)) {
      if ((long)(int)pDVar2[x].slots < 1) {
        iVar9 = 0;
      }
      else {
        bVar7 = true;
        lVar12 = 0;
        iVar9 = 0;
        bVar6 = true;
        do {
          for (pDVar16 = (DdManager *)pDVar2[x].nodelist[lVar12]; pDVar16 != table;
              pDVar16 = (DdManager *)(pDVar16->sentinel).next) {
            pDVar3 = (pDVar16->sentinel).type.kids.T;
            pDVar4 = (pDVar16->sentinel).type.kids.E;
            pDVar13 = (DdNode *)((ulong)pDVar4 & 0xfffffffffffffffe);
            if (pDVar3->index == DVar1) {
              iVar9 = iVar9 + 1;
              DVar14 = pDVar13->index;
              pDVar11 = (pDVar3->type).kids.E;
              pDVar17 = (pDVar3->type).kids.T;
LAB_00934a16:
              pDVar18 = pDVar13;
              pDVar19 = pDVar13;
              if (DVar14 == DVar1) goto LAB_00934a21;
            }
            else {
              DVar14 = pDVar13->index;
              pDVar11 = pDVar3;
              pDVar17 = pDVar3;
              if (DVar14 != DVar1) {
                if (pDVar3 != table->one) {
                  return 0;
                }
                if (table->one != pDVar13) {
                  return 0;
                }
                if ((pDVar16->sentinel).ref != 1) {
                  return 0;
                }
                goto LAB_00934a16;
              }
LAB_00934a21:
              iVar9 = iVar9 + 1;
              pDVar19 = (pDVar13->type).kids.T;
              pDVar18 = (pDVar13->type).kids.E;
            }
            pDVar15 = (DdNode *)((ulong)pDVar19 ^ 1);
            pDVar5 = (DdNode *)((ulong)pDVar18 ^ 1);
            if (((ulong)pDVar4 & 1) == 0) {
              pDVar15 = pDVar19;
              pDVar5 = pDVar18;
            }
            if (((pDVar3 != table->one) || (table->one != pDVar13)) ||
               ((pDVar16->sentinel).ref != 1)) {
              bVar6 = (bool)(bVar6 & pDVar15 == pDVar11);
              bVar7 = (bool)(bVar7 & pDVar17 == pDVar5);
              if (!bVar6 && !bVar7) {
                return 0;
              }
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != (int)pDVar2[x].slots);
      }
      if ((long)(int)pDVar2[y].slots < 1) {
        iVar10 = -1;
      }
      else {
        iVar10 = -1;
        lVar12 = 0;
        do {
          for (pDVar16 = (DdManager *)pDVar2[y].nodelist[lVar12]; pDVar16 != table;
              pDVar16 = (DdManager *)(pDVar16->sentinel).next) {
            iVar10 = iVar10 + (pDVar16->sentinel).ref;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != (int)pDVar2[y].slots);
      }
      uVar8 = (uint)(iVar9 == iVar10);
    }
  }
  return uVar8;
}

Assistant:

int
cuddSymmCheck(
  DdManager * table,
  int  x,
  int  y)
{
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10;
    int comple;         /* f0 is complemented */
    int xsymmy;         /* x and y may be positively symmetric */
    int xsymmyp;        /* x and y may be negatively symmetric */
    int arccount;       /* number of arcs from layer x to layer y */
    int TotalRefCount;  /* total reference count of layer y minus 1 */
    int yindex;
    int i;
    DdNodePtr *list;
    int slots;
    DdNode *sentinel = &(table->sentinel);
#ifdef DD_DEBUG
    int xindex;
#endif

    /* Checks that x and y are not the projection functions.
    ** For x it is sufficient to check whether there is only one
    ** node; indeed, if there is one node, it is the projection function
    ** and it cannot point to y. Hence, if y isn't just the projection
    ** function, it has one arc coming from a layer different from x.
    */
    if (table->subtables[x].keys == 1) {
        return(0);
    }
    yindex = table->invperm[y];
    if (table->subtables[y].keys == 1) {
        if (table->vars[yindex]->ref == 1)
            return(0);
    }

    xsymmy = xsymmyp = 1;
    arccount = 0;
    slots = table->subtables[x].slots;
    list = table->subtables[x].nodelist;
    for (i = 0; i < slots; i++) {
        f = list[i];
        while (f != sentinel) {
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
            f0 = Cudd_Regular(cuddE(f));
            comple = Cudd_IsComplement(cuddE(f));
            if ((int) f1->index == yindex) {
                arccount++;
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                if ((int) f0->index != yindex) {
                    /* If f is an isolated projection function it is
                    ** allowed to bypass layer y.
                    */
                    if (f1 != DD_ONE(table) || f0 != DD_ONE(table) || f->ref != 1)
                        return(0); /* f bypasses layer y */
                }
                f11 = f10 = f1;
            }
            if ((int) f0->index == yindex) {
                arccount++;
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }

            if (f1 != DD_ONE(table) || f0 != DD_ONE(table) || f->ref != 1) {
                xsymmy &= f01 == f10;
                xsymmyp &= f11 == f00;
                if ((xsymmy == 0) && (xsymmyp == 0))
                    return(0);
            }

            f = f->next;
        } /* while */
    } /* for */

    /* Calculate the total reference counts of y */
    TotalRefCount = -1; /* -1 for projection function */
    slots = table->subtables[y].slots;
    list = table->subtables[y].nodelist;
    for (i = 0; i < slots; i++) {
        f = list[i];
        while (f != sentinel) {
            TotalRefCount += f->ref;
            f = f->next;
        }
    }

#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if (arccount == TotalRefCount) {
        xindex = table->invperm[x];
        (void) fprintf(table->out,
                       "Found symmetry! x =%d\ty = %d\tPos(%d,%d)\n",
                       xindex,yindex,x,y);
    }
#endif

    return(arccount == TotalRefCount);

}